

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vbpermd_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  ulong *puVar1;
  uint64_t uVar2;
  int iVar3;
  long lVar4;
  ppc_avr_t result;
  
  result.u64[0] = 0;
  result.u64[1] = 0;
  for (iVar3 = 1; -1 < iVar3; iVar3 = iVar3 + -1) {
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      if (b->u8[0xf - (iVar3 * 8 | (uint)lVar4)] < 0x40) {
        uVar2 = extract64(a->u64[1 - iVar3],0x3f - (uint)b->u8[0xf - (iVar3 * 8 | (uint)lVar4)],1);
        if (uVar2 != 0) {
          puVar1 = (ulong *)((long)&result + (ulong)(1 - iVar3) * 8);
          *puVar1 = *puVar1 | (ulong)(0x80 >> ((byte)lVar4 & 0x1f));
        }
      }
    }
  }
  r->u64[0] = result.u64[0];
  r->u64[1] = result.u64[1];
  return;
}

Assistant:

void helper_vbpermd(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i, j;
    ppc_avr_t result = { .u64 = { 0, 0 } };
    VECTOR_FOR_INORDER_I(i, u64) {
        for (j = 0; j < 8; j++) {
            int index = VBPERMQ_INDEX(b, (i * 8) + j);
            if (index < 64 && EXTRACT_BIT(a, i, index)) {
                result.u64[VBPERMD_INDEX(i)] |= (0x80 >> j);
            }
        }
    }
    *r = result;
}